

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O3

positionTy * __thiscall positionTy::deg2rad(positionTy *this)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  
  if ((*(uint *)&this->f >> 0xb & 1) == 0) {
    dVar1 = this->_lat;
    dVar2 = this->_lon;
    uVar3 = -(ulong)(dVar1 <= (double)DAT_00246830);
    uVar4 = -(ulong)(dVar2 <= DAT_00246830._8_8_);
    auVar5._0_8_ = (double)(~uVar3 & (ulong)(dVar1 + -360.0) | (ulong)dVar1 & uVar3) *
                   3.141592653589793;
    auVar5._8_8_ = (double)(~uVar4 & (ulong)(dVar2 + -360.0) | (ulong)dVar2 & uVar4) *
                   3.141592653589793;
    auVar5 = divpd(auVar5,_DAT_00246830);
    this->_lat = (double)auVar5._0_8_;
    this->_lon = (double)auVar5._8_8_;
    this->f = (posFlagsTy)((ushort)*(uint *)&this->f | 0x800);
  }
  return this;
}

Assistant:

positionTy& positionTy::deg2rad()
{
    if (f.unitAngle == UNIT_DEG) {          // if DEG convert to RAD
        lat() = ::deg2rad(lat());
        lon() = ::deg2rad(lon());
        f.unitAngle = UNIT_RAD;
    }
    return *this;
}